

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *pSVar1;
  FunctionBody *proxy;
  GeneratorVirtualScriptFunction *pGVar2;
  
  pSVar1 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag == SnapGeneratorVirtualScriptFunction) {
    proxy = InflateMap::LookupFunctionBody
                      (inflator,*(TTD_PTR_ID *)((long)snpObject->AddtlSnapObjectInfo + 0x10));
    pGVar2 = Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                       ((pSVar1->super_ScriptContextBase).javascriptLibrary,(FunctionProxy *)proxy);
    return (RecyclableObject *)pGVar2;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapGeneratorVirtualScriptFunctionInfo(const SnapObject *snpObject, InflateMap *inflator)
        {
            Js::ScriptContext *ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapGeneratorVirtualScriptFunctionInfo* sgvsf = SnapObjectGetAddtlInfoAs<SnapGeneratorVirtualScriptFunctionInfo *, SnapObjectType::SnapGeneratorVirtualScriptFunction>(snpObject);
            Js::FunctionBody* fbody = inflator->LookupFunctionBody(sgvsf->BodyRefId);
            return ctx->GetLibrary()->CreateGeneratorVirtualScriptFunction(fbody);
        }